

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O3

size_t ZSTD_estimateCStreamSize(int compressionLevel)

{
  size_t sVar1;
  int compressionLevel_00;
  ulong uVar2;
  ZSTD_CCtx_params cctxParams;
  ZSTD_compressionParameters local_d8;
  ZSTD_CCtx_params local_b8;
  
  compressionLevel_00 = 1;
  if (compressionLevel < 1) {
    compressionLevel_00 = compressionLevel;
  }
  uVar2 = 0;
  do {
    ZSTD_getCParams(&local_d8,compressionLevel_00,0,0);
    local_b8.customMem.customFree = (ZSTD_freeFunction)0x0;
    local_b8.customMem.opaque = (void *)0x0;
    local_b8.ldmParams.hashRateLog = 0;
    local_b8.ldmParams.windowLog = 0;
    local_b8.customMem.customAlloc = (ZSTD_allocFunction)0x0;
    local_b8.ldmParams.enableLdm = 0;
    local_b8.ldmParams.hashLog = 0;
    local_b8.ldmParams.bucketSizeLog = 0;
    local_b8.ldmParams.minMatchLength = 0;
    local_b8.jobSize = 0;
    local_b8.overlapLog = 0;
    local_b8.rsyncable = 0;
    local_b8.forceWindow = 0;
    local_b8.attachDictPref = ZSTD_dictDefaultAttach;
    local_b8.nbWorkers = 0;
    local_b8._60_4_ = 0;
    local_b8.format = ZSTD_f_zstd1;
    local_b8.cParams.targetLength = local_d8.targetLength;
    local_b8.cParams.strategy = local_d8.strategy;
    local_b8.cParams.windowLog = local_d8.windowLog;
    local_b8.cParams.chainLog = local_d8.chainLog;
    local_b8.fParams.noDictIDFlag = 0;
    local_b8.compressionLevel = 3;
    local_b8.fParams.contentSizeFlag = 1;
    local_b8.fParams.checksumFlag = 0;
    sVar1 = ZSTD_estimateCStreamSize_usingCCtxParams(&local_b8);
    if (uVar2 < sVar1) {
      uVar2 = sVar1;
    }
    compressionLevel_00 = compressionLevel_00 + 1;
  } while (compressionLevel + 1 != compressionLevel_00);
  return uVar2;
}

Assistant:

size_t ZSTD_estimateCStreamSize(int compressionLevel)
{
    int level;
    size_t memBudget = 0;
    for (level=MIN(compressionLevel, 1); level<=compressionLevel; level++) {
        size_t const newMB = ZSTD_estimateCStreamSize_internal(level);
        if (newMB > memBudget) memBudget = newMB;
    }
    return memBudget;
}